

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

natwm_error map_search(map *map,void *key,uint32_t *index)

{
  map_entry *entry;
  natwm_error nVar1;
  _Bool _Var2;
  uint32_t uVar3;
  size_t sVar4;
  ulong uVar5;
  size_t i;
  ulong uVar6;
  uint uVar7;
  
  if (index == (uint32_t *)0x0 || key == (void *)0x0) {
    nVar1 = GENERIC_ERROR;
  }
  else {
    sVar4 = (*map->key_size_function)(key);
    uVar3 = (*map->hash_function)(key,sVar4);
    uVar7 = map->length;
    uVar5 = (ulong)uVar3 % (ulong)uVar7;
    for (uVar6 = 0; uVar6 <= uVar7; uVar6 = uVar6 + 1) {
      if (uVar7 <= (uint)uVar5) {
        uVar5 = 0;
      }
      entry = map->entries[uVar5];
      _Var2 = is_entry_present(entry);
      if (_Var2) {
        _Var2 = (*map->key_compare_function)(key,entry->key,sVar4);
        if (_Var2) {
          *index = (uint32_t)uVar5;
          return NO_ERROR;
        }
        uVar7 = map->length;
      }
      uVar5 = (ulong)((uint32_t)uVar5 + 1);
    }
    nVar1 = NOT_FOUND_ERROR;
  }
  return nVar1;
}

Assistant:

static enum natwm_error map_search(const struct map *map, const void *key, uint32_t *index)
{
        if (key == NULL || index == NULL) {
                return GENERIC_ERROR;
        }

        // Initialize index with initial bucket index
        size_t key_size = map->key_size_function(key);
        uint32_t current_index = map->hash_function(key, key_size) % map->length;

        for (size_t i = 0; i <= map->length; ++i) {
                if ((current_index) >= map->length) {
                        current_index = 0;
                }

                struct map_entry *entry = map->entries[current_index];

                if (!is_entry_present(entry)
                    || !map->key_compare_function(key, entry->key, key_size)) {
                        current_index += 1;

                        continue;
                }

                *index = current_index;

                return NO_ERROR;
        }

        return NOT_FOUND_ERROR;
}